

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall
QListWidgetItem::QListWidgetItem(QListWidgetItem *this,QListWidget *listview,int type)

{
  QFlags<Qt::ItemFlag> QVar1;
  QListWidgetItemPrivate *pQVar2;
  QListModel *pQVar3;
  int in_EDX;
  QListWidget *in_RSI;
  QListWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QListModel *model;
  QListWidgetItem *in_stack_ffffffffffffff98;
  ItemFlag other;
  QListWidgetItem *in_stack_ffffffffffffffa0;
  QListModel *pQVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 local_28 [24];
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_10;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c;
  long local_8;
  int row;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QListWidgetItem = (_func_int **)&PTR__QListWidgetItem_00d2f268;
  in_RDI->rtti = in_EDX;
  in_RDI->view = in_RSI;
  pQVar2 = (QListWidgetItemPrivate *)operator_new(0x28);
  QListWidgetItemPrivate::QListWidgetItemPrivate
            ((QListWidgetItemPrivate *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  other = (ItemFlag)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  in_RDI->d = pQVar2;
  local_10.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     (enum_type)in_stack_ffffffffffffffa0);
  local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffa0,other);
  QVar1 = QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffa0,other);
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = (Int)QVar1.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  pQVar3 = listModel(in_stack_ffffffffffffffa0);
  if (pQVar3 != (QListModel *)0x0) {
    pQVar4 = pQVar3;
    QModelIndex::QModelIndex((QModelIndex *)0x89bb02);
    row = (int)((ulong)pQVar4 >> 0x20);
    (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,local_28);
    QListModel::insert((QListModel *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),row,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem::QListWidgetItem(QListWidget *listview, int type)
    : rtti(type), view(listview), d(new QListWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled)
{
    if (QListModel *model = listModel())
        model->insert(model->rowCount(), this);
}